

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCallIndirect(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  Module *pMVar1;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true> _Var2
  ;
  char *pcVar3;
  Type type_00;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long lVar8;
  Expression *pEVar9;
  long lVar10;
  Const *pCVar11;
  Type *pTVar12;
  uintptr_t *puVar13;
  CallIndirect *pCVar14;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  undefined1 auVar15 [8];
  bool isReturn;
  Name NVar16;
  Name NVar17;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar18;
  Type local_a0;
  Literal local_98;
  Expression *local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 local_58 [8];
  Iterator __begin1;
  
  pMVar1 = this->wasm;
  this_00 = &this->random;
  uVar6 = Random::upTo(this_00,(uint32_t)
                               ((ulong)((long)(pMVar1->elementSegments).
                                              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pMVar1->elementSegments).
                                             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
  _Var2.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
  .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
       (pMVar1->elementSegments).
       super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>;
  if (*(long *)((long)_Var2.
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x38) ==
      *(long *)((long)_Var2.
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                      .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40)) {
    pEVar9 = make(this,type);
    return pEVar9;
  }
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)this_00;
  uVar7 = Random::upTo(this_00,(uint32_t)
                               ((ulong)(*(long *)((long)_Var2.
                                                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                                  .
                                                  super__Head_base<0UL,_wasm::ElementSegment_*,_false>
                                                  ._M_head_impl + 0x40) -
                                       *(long *)((long)_Var2.
                                                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                                  .
                                                  super__Head_base<0UL,_wasm::ElementSegment_*,_false>
                                                  ._M_head_impl + 0x38)) >> 3));
  lVar8 = *(long *)((long)_Var2.
                          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x38)
  ;
  uVar6 = uVar7;
  do {
    pcVar3 = *(char **)(lVar8 + (ulong)uVar6 * 8);
    if (*pcVar3 == '+') {
      NVar16.super_IString.str._M_str = *(char **)(pcVar3 + 0x10);
      NVar16.super_IString.str._M_len = (size_t)this->wasm;
      lVar8 = ::wasm::Module::getFunction(NVar16);
      if ((type.id == 1) && (((this->wasm->features).features & 0x80) != 0)) {
        ::wasm::HeapType::getSignature();
        ::wasm::HeapType::getSignature();
        isReturn = extraout_RDX == extraout_RDX_00;
      }
      else {
        isReturn = false;
      }
      ::wasm::HeapType::getSignature();
      if ((isReturn != false) || (extraout_RDX_01 == type.id)) {
        NVar17.super_IString.str._M_str = (char *)(this->funcrefTableName).super_IString.str._M_len;
        NVar17.super_IString.str._M_len = (size_t)this->wasm;
        lVar10 = ::wasm::Module::getTable(NVar17);
        type_00.id = *(uintptr_t *)(lVar10 + 0x48);
        if ((this->allowOOB == true) &&
           (bVar5 = Random::oneIn((Random *)
                                  __begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index,10), bVar5)) {
          pCVar11 = (Const *)make(this,type_00);
        }
        else {
          Literal::makeFromInt32(&local_98,uVar6,type_00);
          pCVar11 = Builder::makeConst(&this->builder,&local_98);
          ::wasm::Literal::~Literal(&local_98);
        }
        auStack_78 = (undefined1  [8])0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)pCVar11;
        local_a0.id = ::wasm::HeapType::getSignature();
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        local_58 = (undefined1  [8])&local_a0;
        PVar18 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_a0)
        ;
        pTVar12 = (Type *)0x0;
        auVar15 = (undefined1  [8])&local_a0;
        while (PVar4.index = (size_t)pTVar12, PVar4.parent = (Type *)auVar15, PVar18 != PVar4) {
          puVar13 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_58);
          local_80 = make(this,(Type)*puVar13);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                     &local_80);
          pTVar12 = (Type *)((long)&(__begin1.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .parent)->id + 1);
          auVar15 = local_58;
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               pTVar12;
        }
        pCVar14 = Builder::
                  makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (&this->builder,(Name)(this->funcrefTableName).super_IString.str,
                             (Expression *)
                             __begin1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)auStack_78,(HeapType)*(uintptr_t *)(lVar8 + 0x38),isReturn);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   auStack_78);
        return (Expression *)pCVar14;
      }
      lVar8 = *(long *)((long)_Var2.
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                       0x38);
    }
    uVar6 = uVar6 + 1;
    if (*(long *)((long)_Var2.
                        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                        .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40) -
        lVar8 >> 3 == (ulong)uVar6) {
      uVar6 = 0;
    }
    if (uVar6 == uVar7) {
      pEVar9 = makeTrivial(this,type);
      return pEVar9;
    }
  } while( true );
}

Assistant:

Expression* TranslateToFuzzReader::makeCallIndirect(Type type) {
  auto& randomElem = wasm.elementSegments[upTo(wasm.elementSegments.size())];
  auto& data = randomElem->data;
  if (data.empty()) {
    return make(type);
  }
  // look for a call target with the right type
  Index start = upTo(data.size());
  Index i = start;
  Function* targetFn;
  bool isReturn;
  while (1) {
    // TODO: handle unreachable
    if (auto* get = data[i]->dynCast<RefFunc>()) {
      targetFn = wasm.getFunction(get->func);
      isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
                 funcContext->func->getResults() == targetFn->getResults();
      if (targetFn->getResults() == type || isReturn) {
        break;
      }
    }
    i++;
    if (i == data.size()) {
      i = 0;
    }
    if (i == start) {
      return makeTrivial(type);
    }
  }
  // with high probability, make sure the type is valid - otherwise, most are
  // going to trap
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  Expression* target;
  if (!allowOOB || !oneIn(10)) {
    target = builder.makeConst(Literal::makeFromInt32(i, addressType));
  } else {
    target = make(addressType);
  }
  std::vector<Expression*> args;
  for (const auto& type : targetFn->getParams()) {
    args.push_back(make(type));
  }
  // TODO: use a random table
  return builder.makeCallIndirect(
    funcrefTableName, target, args, targetFn->type, isReturn);
}